

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cc
# Opt level: O3

void __thiscall avro::Name::check(Name *this)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  undefined8 *puVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = (this->ns_)._M_string_length;
  if (uVar2 != 0) {
    pcVar3 = (this->ns_)._M_dataplus._M_p;
    if ((*pcVar3 == '.') || (pcVar3[uVar2 - 1] == '.')) goto LAB_0014ff11;
    pcVar10 = pcVar3 + uVar2;
    pcVar9 = pcVar3;
    if (0 < (long)uVar2 >> 2) {
      lVar7 = ((long)uVar2 >> 2) + 1;
      pcVar8 = pcVar3 + 3;
      do {
        cVar1 = pcVar8[-3];
        iVar4 = isalnum((int)cVar1);
        if (((iVar4 == 0) && (cVar1 != '_')) && (cVar1 != '.')) {
          pcVar9 = pcVar8 + -3;
          goto LAB_0014fd2f;
        }
        cVar1 = pcVar8[-2];
        iVar4 = isalnum((int)cVar1);
        if (((iVar4 == 0) && (cVar1 != '_')) && (cVar1 != '.')) {
          pcVar9 = pcVar8 + -2;
          goto LAB_0014fd2f;
        }
        cVar1 = pcVar8[-1];
        iVar4 = isalnum((int)cVar1);
        if (((iVar4 == 0) && (cVar1 != '_')) && (cVar1 != '.')) {
          pcVar9 = pcVar8 + -1;
          goto LAB_0014fd2f;
        }
        cVar1 = *pcVar8;
        iVar4 = isalnum((int)cVar1);
        if (((iVar4 == 0) && (cVar1 != '_')) && (pcVar9 = pcVar8, cVar1 != '.')) goto LAB_0014fd2f;
        lVar7 = lVar7 + -1;
        pcVar8 = pcVar8 + 4;
        pcVar9 = pcVar3 + (uVar2 & 0xfffffffffffffffc);
      } while (1 < lVar7);
    }
    lVar7 = (long)pcVar10 - (long)pcVar9;
    if (lVar7 == 1) {
LAB_0014fd10:
      iVar6 = (int)*pcVar9;
      iVar4 = isalnum(iVar6);
      if (iVar4 != 0) {
        pcVar9 = pcVar10;
      }
      if (iVar6 == 0x5f) {
        pcVar9 = pcVar10;
      }
      if (iVar6 == 0x2e) {
        pcVar9 = pcVar10;
      }
    }
    else if (lVar7 == 2) {
LAB_0014fcfa:
      cVar1 = *pcVar9;
      iVar4 = isalnum((int)cVar1);
      if (((iVar4 != 0) || (cVar1 == '_')) || (cVar1 == '.')) {
        pcVar9 = pcVar9 + 1;
        goto LAB_0014fd10;
      }
    }
    else {
      if (lVar7 != 3) goto LAB_0014fd38;
      cVar1 = *pcVar9;
      iVar4 = isalnum((int)cVar1);
      if (((iVar4 != 0) || (cVar1 == '_')) || (cVar1 == '.')) {
        pcVar9 = pcVar9 + 1;
        goto LAB_0014fcfa;
      }
    }
LAB_0014fd2f:
    if (pcVar9 != pcVar10) {
LAB_0014ff11:
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
      std::operator+(&local_50,"Invalid namespace: ",&this->ns_);
      std::runtime_error::runtime_error((runtime_error *)(puVar5 + 1),(string *)&local_50);
      *puVar5 = 0x17fa60;
      puVar5[1] = 0x17fa90;
      __cxa_throw(puVar5,&Exception::typeinfo,Exception::~Exception);
    }
  }
LAB_0014fd38:
  uVar2 = (this->simpleName_)._M_string_length;
  if (uVar2 == 0) goto LAB_0014feac;
  pcVar10 = (this->simpleName_)._M_dataplus._M_p;
  pcVar3 = pcVar10 + uVar2;
  pcVar9 = pcVar10;
  if (0 < (long)uVar2 >> 2) {
    pcVar9 = pcVar10 + (uVar2 & 0xfffffffffffffffc);
    lVar7 = ((long)uVar2 >> 2) + 1;
    pcVar10 = pcVar10 + 3;
    do {
      cVar1 = pcVar10[-3];
      iVar4 = isalnum((int)cVar1);
      if ((cVar1 != 0x5f) && (iVar4 == 0)) {
        pcVar10 = pcVar10 + -3;
        goto LAB_0014fe48;
      }
      cVar1 = pcVar10[-2];
      iVar4 = isalnum((int)cVar1);
      if ((cVar1 != 0x5f) && (iVar4 == 0)) {
        pcVar10 = pcVar10 + -2;
        goto LAB_0014fe48;
      }
      cVar1 = pcVar10[-1];
      iVar4 = isalnum((int)cVar1);
      if ((cVar1 != 0x5f) && (iVar4 == 0)) {
        pcVar10 = pcVar10 + -1;
        goto LAB_0014fe48;
      }
      cVar1 = *pcVar10;
      iVar4 = isalnum((int)cVar1);
      if ((cVar1 != 0x5f) && (iVar4 == 0)) goto LAB_0014fe48;
      lVar7 = lVar7 + -1;
      pcVar10 = pcVar10 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)pcVar3 - (long)pcVar9;
  if (lVar7 == 1) {
LAB_0014fe1f:
    cVar1 = *pcVar9;
    iVar4 = isalnum((int)cVar1);
    if (iVar4 != 0) {
      pcVar9 = pcVar3;
    }
    pcVar10 = pcVar9;
    if (cVar1 == 0x5f) {
      pcVar10 = pcVar3;
    }
  }
  else if (lVar7 == 2) {
LAB_0014fe08:
    cVar1 = *pcVar9;
    iVar4 = isalnum((int)cVar1);
    if ((cVar1 == 0x5f) || (pcVar10 = pcVar9, iVar4 != 0)) {
      pcVar9 = pcVar9 + 1;
      goto LAB_0014fe1f;
    }
  }
  else {
    if (lVar7 != 3) {
      return;
    }
    cVar1 = *pcVar9;
    iVar4 = isalnum((int)cVar1);
    if ((cVar1 == 0x5f) || (pcVar10 = pcVar9, iVar4 != 0)) {
      pcVar9 = pcVar9 + 1;
      goto LAB_0014fe08;
    }
  }
LAB_0014fe48:
  if (pcVar10 == pcVar3) {
    return;
  }
LAB_0014feac:
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
  std::operator+(&local_50,"Invalid name: ",&this->simpleName_);
  std::runtime_error::runtime_error((runtime_error *)(puVar5 + 1),(string *)&local_50);
  *puVar5 = 0x17fa60;
  puVar5[1] = 0x17fa90;
  __cxa_throw(puVar5,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Name::check() const
{
    if (! ns_.empty() && (ns_[0] == '.' || ns_[ns_.size() - 1] == '.' || std::find_if(ns_.begin(), ns_.end(), invalidChar1) != ns_.end())) {
        throw Exception("Invalid namespace: " + ns_);
    }
    if (simpleName_.empty() || std::find_if(simpleName_.begin(), simpleName_.end(), invalidChar2) != simpleName_.end()) {
        throw Exception("Invalid name: " + simpleName_);
    }
}